

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase336::run(TestCase336 *this)

{
  size_t sVar1;
  uint *puVar2;
  int local_98;
  bool local_91;
  int local_90;
  bool _kj_shouldLog_3;
  int local_88;
  bool _kj_shouldLog_2;
  int local_80;
  bool _kj_shouldLog_1;
  size_t sStack_78;
  bool _kj_shouldLog;
  int local_6c;
  Fault local_68;
  Fault f;
  anon_class_1_0_00000001 local_49;
  Mapper<unsigned_int_(&)[4]> local_48;
  undefined1 local_40 [8];
  Array<unsigned_int> bar;
  uint foo [4];
  TestCase336 *this_local;
  
  bar.disposer = (ArrayDisposer *)0x200000001;
  _::Mapper<unsigned_int_(&)[4]>::Mapper(&local_48,(uint *)&bar.disposer);
  _::Mapper<unsigned_int_(&)[4]>::
  operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_array_test_c__:338:21)>
            ((Array<unsigned_int> *)local_40,&local_48,&local_49);
  sVar1 = Array<unsigned_int>::size((Array<unsigned_int> *)local_40);
  if (sVar1 != 4) {
    local_6c = 4;
    sStack_78 = Array<unsigned_int>::size((Array<unsigned_int> *)local_40);
    _::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x153,FAILED,"(4) == (bar.size())","4, bar.size()",&local_6c,
               &stack0xffffffffffffff88);
    _::Debug::Fault::fatal(&local_68);
  }
  puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,0);
  if (*puVar2 != 1) {
    _kj_shouldLog_1 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_1 != false) {
      local_80 = 1;
      puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,0);
      _::Debug::log<char_const(&)[33],int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x154,ERROR,"\"failed: expected \" \"(1) == (bar[0])\", 1, bar[0]",
                 (char (*) [33])"failed: expected (1) == (bar[0])",&local_80,puVar2);
      _kj_shouldLog_1 = false;
    }
  }
  puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,1);
  if (*puVar2 != 4) {
    _kj_shouldLog_2 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_2 != false) {
      local_88 = 4;
      puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,1);
      _::Debug::log<char_const(&)[33],int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x155,ERROR,"\"failed: expected \" \"(4) == (bar[1])\", 4, bar[1]",
                 (char (*) [33])"failed: expected (4) == (bar[1])",&local_88,puVar2);
      _kj_shouldLog_2 = false;
    }
  }
  puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,2);
  if (*puVar2 != 9) {
    _kj_shouldLog_3 = _::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_3 != false) {
      local_90 = 9;
      puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,2);
      _::Debug::log<char_const(&)[33],int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x156,ERROR,"\"failed: expected \" \"(9) == (bar[2])\", 9, bar[2]",
                 (char (*) [33])"failed: expected (9) == (bar[2])",&local_90,puVar2);
      _kj_shouldLog_3 = false;
    }
  }
  puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,3);
  if (*puVar2 != 0x10) {
    local_91 = _::Debug::shouldLog(ERROR);
    while (local_91 != false) {
      local_98 = 0x10;
      puVar2 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_40,3);
      _::Debug::log<char_const(&)[34],int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x157,ERROR,"\"failed: expected \" \"(16) == (bar[3])\", 16, bar[3]",
                 (char (*) [34])"failed: expected (16) == (bar[3])",&local_98,puVar2);
      local_91 = false;
    }
  }
  Array<unsigned_int>::~Array((Array<unsigned_int> *)local_40);
  return;
}

Assistant:

TEST(Array, MapRawArray) {
  uint foo[4] = {1, 2, 3, 4};
  Array<uint> bar = KJ_MAP(i, foo) -> uint { return i * i; };
  ASSERT_EQ(4, bar.size());
  EXPECT_EQ(1, bar[0]);
  EXPECT_EQ(4, bar[1]);
  EXPECT_EQ(9, bar[2]);
  EXPECT_EQ(16, bar[3]);
}